

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O2

void FRandom::StaticPrintSeeds(void)

{
  FRandom *pFVar1;
  int iVar2;
  FRandom **ppFVar3;
  
  ppFVar3 = &RNGList;
  while (pFVar1 = *ppFVar3, pFVar1 != (FRandom *)0x0) {
    iVar2 = pFVar1->idx;
    if (0x13 < pFVar1->idx) {
      iVar2 = 0;
    }
    Printf("%s: %08x .. %d\n",pFVar1->Name,(ulong)*(uint *)((long)&pFVar1->sfmt + (long)iVar2 * 4));
    ppFVar3 = &pFVar1->Next;
  }
  return;
}

Assistant:

void FRandom::StaticPrintSeeds ()
{
	FRandom *rng = RNGList;

	while (rng != NULL)
	{
		int idx = rng->idx < SFMT::N32 ? rng->idx : 0;
		Printf ("%s: %08x .. %d\n", rng->Name, rng->sfmt.u[idx], idx);
		rng = rng->Next;
	}
}